

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_viewConversion.h
# Opt level: O0

int gmlc::utilities::numeric_conversionComplete<int>(string_view V,int defValue)

{
  string_view V_00;
  string_view V_01;
  bool bVar1;
  int iVar2;
  int iVar3;
  size_type sVar4;
  const_reference pvVar5;
  int in_EDX;
  invalid_argument *anon_var_0;
  int res;
  size_t rem;
  size_t in_stack_ffffffffffffff78;
  size_t *in_stack_ffffffffffffff80;
  size_type sVar6;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  char *in_stack_ffffffffffffff90;
  int local_3c;
  size_type local_38;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  int local_4;
  
  V_00._M_str = (char *)in_stack_ffffffffffffff80;
  V_00._M_len = in_stack_ffffffffffffff78;
  bVar1 = nonNumericFirstOrLastCharacter(V_00);
  local_4 = in_EDX;
  if (!bVar1) {
    V_01._M_len._4_4_ = in_stack_ffffffffffffff8c;
    V_01._M_len._0_4_ = in_stack_ffffffffffffff88;
    V_01._M_str = in_stack_ffffffffffffff90;
    iVar2 = numConvComp<int>(V_01,in_stack_ffffffffffffff80);
    while (sVar6 = local_38,
          sVar4 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::length(&local_18),
          local_3c = iVar2, sVar6 < sVar4) {
      pvVar5 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         (&local_18,local_38);
      iVar3 = isspace((int)*pvVar5);
      local_3c = in_EDX;
      if (iVar3 == 0) break;
      local_38 = local_38 + 1;
    }
    local_4 = local_3c;
  }
  return local_4;
}

Assistant:

X numeric_conversionComplete(std::string_view V, const X defValue)
{
    if (nonNumericFirstOrLastCharacter(V)) {
        return defValue;
    }
    try {
        size_t rem;
        X res = numConvComp<X>(V, rem);
        while (rem < V.length()) {
            if (!(isspace(V[rem]))) {
                res = defValue;
                break;
            }
            ++rem;
        }
        return res;
    }
    catch (const std::invalid_argument&) {
        return defValue;
    }
}